

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_getType(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  size_t typeTag;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (_Var1) {
    context_local = *(sysbvm_context_t **)tuple;
  }
  else if ((tuple & 0xf) == 0xf) {
    context_local =
         (sysbvm_context_t *)sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,tuple >> 4);
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_tuple_getImmediateTypeWithTag(context,tuple & 0xf);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_INLINE sysbvm_tuple_t sysbvm_tuple_getType(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(sysbvm_tuple_isNonNullPointer(tuple))
    {
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->header.typePointer;
    }
    else
    {
        size_t typeTag = tuple & SYSBVM_TUPLE_TAG_BIT_MASK;
        if(typeTag != SYSBVM_TUPLE_TAG_TRIVIAL)
            return sysbvm_tuple_getImmediateTypeWithTag(context, typeTag);
        else
            return sysbvm_tuple_getImmediateTrivialTypeWithIndex(context, tuple >> SYSBVM_TUPLE_TAG_BIT_COUNT);
    }
}